

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void SettingsHandlerWindow_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  uint uVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindowSettings *pIVar4;
  int iVar5;
  ulong uVar6;
  ImGuiWindowSettings *pIVar7;
  char *__function;
  long lVar8;
  ulong uVar9;
  
  uVar1 = (ctx->Windows).Size;
  uVar6 = (ulong)uVar1;
  if (uVar1 != 0) {
    uVar9 = 0;
    do {
      if ((long)(int)uVar6 <= (long)uVar9) {
        __function = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_00116e40;
      }
      pIVar3 = (ctx->Windows).Data[uVar9];
      if ((pIVar3->Flags & 0x100) == 0) {
        iVar2 = pIVar3->SettingsIdx;
        if ((long)iVar2 == -1) {
          pIVar7 = ImGui::FindWindowSettings(pIVar3->ID);
        }
        else {
          if ((ctx->SettingsWindows).Size <= iVar2) goto LAB_00116e14;
          pIVar7 = (ctx->SettingsWindows).Data + iVar2;
        }
        if (pIVar7 == (ImGuiWindowSettings *)0x0) {
          pIVar7 = ImGui::CreateNewWindowSettings(pIVar3->Name);
          pIVar4 = (ctx->SettingsWindows).Data;
          if ((pIVar7 < pIVar4) || (pIVar4 + (ctx->SettingsWindows).Size <= pIVar7)) {
            __assert_fail("it >= Data && it < Data + Size",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                          ,0x506,
                          "int ImVector<ImGuiWindowSettings>::index_from_ptr(const T *) const [T = ImGuiWindowSettings]"
                         );
          }
          pIVar3->SettingsIdx = (int)((ulong)((long)pIVar7 - (long)pIVar4) >> 3) * -0x55555555;
        }
        if (pIVar7->ID != pIVar3->ID) {
          __assert_fail("settings->ID == window->ID",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                        ,0x249e,
                        "void SettingsHandlerWindow_WriteAll(ImGuiContext *, ImGuiSettingsHandler *, ImGuiTextBuffer *)"
                       );
        }
        pIVar7->Pos = (ImVec2ih)((int)(pIVar3->Pos).x & 0xffffU | (int)(pIVar3->Pos).y << 0x10);
        pIVar7->Size = (ImVec2ih)
                       ((int)(pIVar3->SizeFull).x & 0xffffU | (int)(pIVar3->SizeFull).y << 0x10);
        pIVar7->Collapsed = pIVar3->Collapsed;
      }
      uVar9 = uVar9 + 1;
      uVar6 = (ulong)(uint)(ctx->Windows).Size;
    } while (uVar9 != uVar6);
  }
  iVar2 = (buf->Buf).Size;
  iVar5 = iVar2 + -1;
  if (iVar2 == 0) {
    iVar5 = 0;
  }
  ImGuiTextBuffer::reserve(buf,(ctx->SettingsWindows).Size * 0x60 + iVar5);
  uVar1 = (ctx->SettingsWindows).Size;
  uVar6 = (ulong)uVar1;
  if (uVar1 != 0) {
    lVar8 = 0x14;
    uVar9 = 0;
    do {
      if ((long)(int)uVar6 <= (long)uVar9) {
LAB_00116e14:
        __function = "T &ImVector<ImGuiWindowSettings>::operator[](int) [T = ImGuiWindowSettings]";
LAB_00116e40:
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                      ,0x4e6,__function);
      }
      pIVar7 = (ctx->SettingsWindows).Data;
      ImGuiTextBuffer::appendf
                (buf,"[%s][%s]\n",handler->TypeName,*(undefined8 *)((long)pIVar7 + lVar8 + -0x14));
      ImGuiTextBuffer::appendf
                (buf,"Pos=%d,%d\n",(ulong)(uint)(int)*(short *)((long)pIVar7 + lVar8 + -8),
                 (ulong)(uint)(int)*(short *)((long)pIVar7 + lVar8 + -6));
      ImGuiTextBuffer::appendf
                (buf,"Size=%d,%d\n",(ulong)(uint)(int)*(short *)((long)pIVar7 + lVar8 + -4),
                 (ulong)(uint)(int)*(short *)((long)pIVar7 + lVar8 + -2));
      ImGuiTextBuffer::appendf(buf,"Collapsed=%d\n",(ulong)*(byte *)((long)&pIVar7->Name + lVar8));
      ImGuiTextBuffer::appendf(buf,"\n");
      uVar9 = uVar9 + 1;
      uVar6 = (ulong)(uint)(ctx->SettingsWindows).Size;
      lVar8 = lVar8 + 0x18;
    } while (uVar9 != uVar6);
  }
  return;
}

Assistant:

static void SettingsHandlerWindow_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    // Gather data from windows that were active during this session
    // (if a window wasn't opened in this session we preserve its settings)
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;

        ImGuiWindowSettings* settings = (window->SettingsIdx != -1) ? &g.SettingsWindows[window->SettingsIdx] : ImGui::FindWindowSettings(window->ID);
        if (!settings)
        {
            settings = ImGui::CreateNewWindowSettings(window->Name);
            window->SettingsIdx = g.SettingsWindows.index_from_ptr(settings);
        }
        IM_ASSERT(settings->ID == window->ID);
        settings->Pos = ImVec2ih((short)window->Pos.x, (short)window->Pos.y);
        settings->Size = ImVec2ih((short)window->SizeFull.x, (short)window->SizeFull.y);
        settings->Collapsed = window->Collapsed;
    }

    // Write to text buffer
    buf->reserve(buf->size() + g.SettingsWindows.Size * 96); // ballpark reserve
    for (int i = 0; i != g.SettingsWindows.Size; i++)
    {
        const ImGuiWindowSettings* settings = &g.SettingsWindows[i];
        buf->appendf("[%s][%s]\n", handler->TypeName, settings->Name);
        buf->appendf("Pos=%d,%d\n", settings->Pos.x, settings->Pos.y);
        buf->appendf("Size=%d,%d\n", settings->Size.x, settings->Size.y);
        buf->appendf("Collapsed=%d\n", settings->Collapsed);
        buf->appendf("\n");
    }
}